

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

string * chooseMap_abi_cxx11_(void)

{
  pointer pbVar1;
  bool bVar2;
  path *this;
  ostream *poVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *map;
  pointer pbVar5;
  string *in_RDI;
  uint uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  directory_iterator local_e8;
  directory_iterator __end1;
  __shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
  local_c8;
  uint mapChoice;
  __shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
  local_78;
  __shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
  local_60;
  string local_50;
  
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::experimental::filesystem::v1::current_path_abi_cxx11_((v1 *)&mapChoice);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_c8,(path *)&mapChoice);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&mapChoice);
  std::__shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_78,&local_c8);
  local_e8._M_dir.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_78._M_ptr;
  local_e8._M_dir.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_78._M_refcount._M_pi;
  local_78._M_ptr = (element_type *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  std::__shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_60,&local_c8);
  __end1._M_dir.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  __end1._M_dir.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  while (local_e8._M_dir.
         super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi !=
         __end1._M_dir.
         super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi) {
    this = (path *)std::experimental::filesystem::v1::__cxx11::directory_iterator::operator*
                             (&local_e8);
    bVar2 = std::experimental::filesystem::v1::__cxx11::path::has_extension(this);
    if (bVar2) {
      std::experimental::filesystem::v1::__cxx11::path::extension((path *)&mapChoice,this);
      std::experimental::filesystem::v1::__cxx11::path::string(&local_50,(path *)&mapChoice);
      bVar2 = std::operator==(&local_50,".map");
      std::__cxx11::string::~string((string *)&local_50);
      std::experimental::filesystem::v1::__cxx11::path::~path((path *)&mapChoice);
      if (bVar2) {
        std::experimental::filesystem::v1::__cxx11::path::filename((path *)&mapChoice,this);
        std::__cxx11::string::string((string *)&local_50,(string *)&mapChoice);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                   &local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::experimental::filesystem::v1::__cxx11::path::~path((path *)&mapChoice);
      }
    }
    std::experimental::filesystem::v1::__cxx11::directory_iterator::operator++(&local_e8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&__end1._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  if (local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,"",(allocator<char> *)&mapChoice);
  }
  else {
    do {
      std::operator<<((ostream *)&std::cout,"\nplease choose a map :\n");
      pbVar1 = local_108.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = 0;
      for (pbVar5 = local_108.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        uVar6 = uVar6 + 1;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar3 = std::operator<<(poVar3," - ");
        poVar3 = std::operator<<(poVar3,(string *)pbVar5);
        std::operator<<(poVar3,"\n");
      }
      std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
      std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13f520);
      std::istream::ignore((long)&std::cin,0x200);
    } while (uVar6 <= mapChoice - 1);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&local_108,(ulong)(mapChoice - 1));
    std::__cxx11::string::string((string *)in_RDI,(string *)pvVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  return in_RDI;
}

Assistant:

static std::string chooseMap() {
    vector<std::string> mapList = vector<std::string>();
    for (const auto& entry : fs::directory_iterator(fs::current_path())) {
        if (entry.path().has_extension() && entry.path().extension().string() == ".map") {
            mapList.push_back(entry.path().filename());
        }
    }
    if (!mapList.empty()) {
        unsigned int mapChoice;
        unsigned int numberMaps;
        do {
            cout << "\nplease choose a map :\n";
            numberMaps = 0;
            for (const auto& map : mapList) {
                numberMaps++;
                cout << numberMaps << " - " << map << "\n";
            }
            cin >> mapChoice;
            cin.clear();
            cin.ignore(512, '\n');
        } while (mapChoice < 1 || mapChoice > numberMaps || isnan(mapChoice));
        return std::string(mapList.at(mapChoice - 1));
    }
    return "";
}